

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

void uset_removeString_63(USet *set,UChar *str,int32_t strLen)

{
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString s;
  int32_t strLen_local;
  UChar *str_local;
  USet *set_local;
  
  s.fUnion._52_4_ = strLen;
  icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_68,str);
  icu_63::UnicodeString::UnicodeString
            ((UnicodeString *)local_60,strLen == -1,&local_68,s.fUnion._52_4_);
  icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  icu_63::UnicodeSet::remove((UnicodeSet *)set,local_60);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uset_removeString(USet* set, const UChar* str, int32_t strLen) {
    UnicodeString s(strLen==-1, str, strLen);
    ((UnicodeSet*) set)->UnicodeSet::remove(s);
}